

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.h
# Opt level: O3

void __thiscall server::captureservmode::replenishammo(captureservmode *this,clientinfo *ci)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  
  if ((((0x19 < gamemode + 3U) || ((0x85503fUL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) != 0)) &&
      (this->notgotbases == false)) &&
     ((((ci->state).state == 0 && (ci->team[0] != '\0')) &&
      (lVar4 = (long)(this->bases).ulen, 0 < lVar4)))) {
    piVar5 = &((this->bases).buf)->ammo;
    lVar6 = 0;
    do {
      uVar2 = piVar5[-2] - 1;
      if (((uVar2 < 6) &&
          (fVar7 = (((baseinfo *)(piVar5 + -0x88))->o).field_0.field_0.x -
                   (ci->state).o.field_0.field_0.x,
          fVar8 = (float)piVar5[-0x87] - (ci->state).o.field_0.field_0.y,
          fVar7 * fVar7 + fVar8 * fVar8 <= 4096.0)) &&
         ((ABS((float)piVar5[-0x86] - (ci->state).o.field_0.field_0.z) <= 24.0 &&
          ((((ci->state).super_fpsstate.ammo[(uint)piVar5[-2]] < itemstats[uVar2].max &&
            (iVar1 = strcmp((char *)(piVar5 + -0x85),ci->team), iVar1 == 0)) && (0 < *piVar5)))))) {
        *piVar5 = *piVar5 + -1;
        sendbaseinfo(this,(int)lVar6);
        sendf(-1,1,"riii",0x44,(ulong)(uint)ci->clientnum,(ulong)(uint)piVar5[-2]);
        lVar4 = (long)piVar5[-2];
        iVar1 = *(int *)((long)&PTR_flush_00181520 + lVar4 * 0x20 + 4);
        iVar3 = *(int *)(&PTR_flush_00181520 + lVar4 * 4) + (ci->state).super_fpsstate.ammo[lVar4];
        if (iVar1 <= iVar3) {
          iVar3 = iVar1;
        }
        (ci->state).super_fpsstate.ammo[lVar4] = iVar3;
        return;
      }
      lVar6 = lVar6 + 1;
      piVar5 = piVar5 + 0x8d;
    } while (lVar4 != lVar6);
  }
  return;
}

Assistant:

void replenishammo(clientinfo *ci)
    {
        if(m_noitems || notgotbases || ci->state.state!=CS_ALIVE || !ci->team[0]) return;
        loopv(bases)
        {
            baseinfo &b = bases[i];
            if(b.valid() && insidebase(b, ci->state.o) && !ci->state.hasmaxammo(b.ammotype-1+I_SHELLS) && b.takeammo(ci->team))
            {
                sendbaseinfo(i);
                sendf(-1, 1, "riii", N_REPAMMO, ci->clientnum, b.ammotype);
                ci->state.addammo(b.ammotype);
                break;
            }
        }
    }